

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O1

void andres::marray_detail::
     OperateHelperBinary<(unsigned_short)6,_andres::marray_detail::DividedByEqual<int,_int>,_int,_int,_false,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
     ::operate(View<int,_false,_std::allocator<unsigned_long>_> *v,
              View<int,_false,_std::allocator<unsigned_long>_> *w,long param_3,long param_4)

{
  size_t sVar1;
  ulong uVar2;
  
  sVar1 = View<int,_false,_std::allocator<unsigned_long>_>::shape(v,5);
  if (sVar1 != 0) {
    uVar2 = 0;
    do {
      OperateHelperBinary<(unsigned_short)5,_andres::marray_detail::DividedByEqual<int,_int>,_int,_int,_false,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
      ::operate(v,w,param_3,param_4);
      sVar1 = View<int,_false,_std::allocator<unsigned_long>_>::strides(v,5);
      param_3 = param_3 + sVar1 * 4;
      sVar1 = View<int,_false,_std::allocator<unsigned_long>_>::strides(w,5);
      param_4 = param_4 + sVar1 * 4;
      uVar2 = uVar2 + 1;
      sVar1 = View<int,_false,_std::allocator<unsigned_long>_>::shape(v,5);
    } while (uVar2 < sVar1);
  }
  View<int,_false,_std::allocator<unsigned_long>_>::shape(v,5);
  View<int,_false,_std::allocator<unsigned_long>_>::strides(v,5);
  View<int,_false,_std::allocator<unsigned_long>_>::shape(w,5);
  View<int,_false,_std::allocator<unsigned_long>_>::strides(w,5);
  return;
}

Assistant:

static inline void operate
    (
        View<T1, false, A1>& v, 
        const View<T2, isConst, A2>& w, 
        Functor f, 
        T1* data1,
        const T2* data2
    )
    {
        for(std::size_t j=0; j<v.shape(N-1); ++j) {
            OperateHelperBinary<N-1, Functor, T1, T2, isConst, A1, A2>::operate(
                v, w, f, data1, data2);
            data1 += v.strides(N-1);
            data2 += w.strides(N-1);
        }
        data1 -= v.shape(N-1) * v.strides(N-1);
        data2 -= w.shape(N-1) * w.strides(N-1);
    }